

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

void __thiscall
optimization::common_expr_del::BlockNodes::export_insts(BlockNodes *this,BasicBlk *block)

{
  __index_type _Var1;
  uint32_t uVar2;
  uint uVar3;
  Inst *pIVar4;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  pointer pcVar5;
  pointer pvVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar7;
  _List_node_base **pp_Var8;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_01;
  BasicBlk *pBVar9;
  int iVar10;
  pointer psVar11;
  _List_node_base *p_Var12;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar13;
  variant_alternative_t<0UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar14;
  Displayable DVar15;
  variant_alternative_t<1UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar16;
  variant_alternative_t<2UL,_variant<Op,_ExtraNormOp,_InNormOp>_> *pvVar17;
  variant_alternative_t<2UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  variant_alternative_t<1UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar20;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var21;
  variant_alternative_t<0UL,_variant<int,_NodeId,_basic_string<char>_>_> *pvVar22;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var23;
  mapped_type *pmVar24;
  pointer puVar25;
  mapped_type *pmVar26;
  ulong uVar27;
  _List_node_base *p_Var28;
  OpInst *pOVar29;
  pointer psVar30;
  pointer *__ptr_1;
  _List_node_base *p_Var31;
  element_type *peVar32;
  pointer pvVar33;
  undefined8 *puVar34;
  undefined4 uVar35;
  uint32_t uVar36;
  ulong uVar37;
  _List_node_base *p_Var38;
  pointer puVar39;
  pointer *__ptr;
  pointer puVar40;
  BlockNodes *this_02;
  long lVar41;
  bool bVar42;
  Value lhs;
  VarId varId;
  iterator __end2;
  Value rhs;
  Var_Replace vp;
  Value offset_1;
  undefined1 local_358 [8];
  variant<int,_mir::inst::VarId> vStack_350;
  pointer local_338;
  undefined1 local_330 [8];
  variant<int,_mir::inst::VarId> local_328;
  __index_type local_310;
  _List_node_base *local_308;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_300;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_2f8;
  _List_node_base *local_2f0;
  undefined1 local_2e8 [8];
  variant<int,_mir::inst::VarId> vStack_2e0;
  undefined1 local_2c8 [8];
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_2c0;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_290;
  VarId local_260;
  BlockNodes *local_250;
  undefined **local_248;
  undefined1 local_240 [8];
  variant<int,_mir::inst::VarId> local_238;
  OpInst *local_220;
  BasicBlk *local_218;
  undefined **local_210;
  undefined **local_208;
  undefined **local_200;
  undefined **local_1f8;
  undefined **local_1f0;
  anon_class_8_1_a78179b7_conflict local_1e8;
  VarId local_1e0;
  VarId local_1d0;
  Operand local_1c0;
  Operand local_198;
  Operand local_170;
  Operand local_148;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  Operand local_f8;
  Operand local_d0;
  Operand local_a8;
  Operand local_80;
  variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  psVar11 = (this->nodes).
            super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar30 = psVar11;
  if (psVar11 !=
      (this->nodes).
      super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      Node::init_main_var((psVar30->
                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
      psVar30 = psVar30 + 1;
    } while (psVar30 !=
             (this->nodes).
             super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    psVar11 = (this->nodes).
              super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar27 = (this->added)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while (uVar37 = (long)psVar30 - (long)psVar11 >> 4, uVar27 < uVar37) {
    uVar36 = (int)uVar37 - 1;
    if (-1 < (int)uVar36) {
      do {
        exportNode(this,uVar36);
        bVar42 = uVar36 != 0;
        uVar36 = uVar36 - 1;
      } while (bVar42);
      uVar27 = (this->added)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      psVar11 = (this->nodes).
                super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar30 = (this->nodes).
                super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  puVar39 = (block->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar25 = (block->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar40 = puVar39;
  local_250 = this;
  if (puVar25 != puVar39) {
    do {
      pIVar4 = (puVar40->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar4 != (Inst *)0x0) {
        (*(pIVar4->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar40->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar40 = puVar40 + 1;
    } while (puVar40 != puVar25);
    (block->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar39;
  }
  local_2f8 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
               *)&block->inst;
  p_Var31 = (_List_node_base *)&local_250->exportQueue;
  p_Var38 = (local_250->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  p_Var12 = p_Var31;
  p_Var28 = p_Var38;
  this_02 = local_250;
  local_308 = p_Var31;
  local_218 = block;
  if (p_Var38 != p_Var31) {
    do {
      p_Var12 = p_Var12->_M_prev;
      if (p_Var28 == p_Var12) break;
      uVar35 = *(undefined4 *)&p_Var28[1]._M_next;
      *(undefined4 *)&p_Var28[1]._M_next = *(undefined4 *)&p_Var12[1]._M_next;
      *(undefined4 *)&p_Var12[1]._M_next = uVar35;
      pp_Var8 = &p_Var28->_M_next;
      p_Var28 = *pp_Var8;
    } while (*pp_Var8 != p_Var12);
    local_1f0 = &PTR_display_001ed3a8;
    local_300._M_head_impl = (Inst *)&PTR_display_001ecf98;
    local_248 = &PTR_display_001ecfe8;
    local_208 = &PTR_display_001ed1c8;
    local_210 = &PTR_display_001ed288;
    local_1f8 = &PTR_display_001ed168;
    local_200 = &PTR_display_001ed348;
    do {
      psVar11 = (this_02->nodes).
                super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      peVar32 = psVar11[*(uint *)&p_Var38[1]._M_next].
                super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (peVar32->is_leaf == false) {
        psVar11 = psVar11 + *(uint *)&p_Var38[1]._M_next;
        _Var1 = (peVar32->op).
                super__Variant_base<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                .
                super__Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                .
                super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                .
                super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                .
                super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                .
                super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                ._M_index;
        local_338 = psVar11;
        if (_Var1 == '\x02') {
          pvVar17 = std::
                    get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              (&peVar32->op);
          if (*pvVar17 == Call) {
            pvVar18 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((((psVar11->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->operands).
                                 super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
            local_330 = (undefined1  [8])
                        ((long)&local_328.super__Variant_base<int,_mir::inst::VarId>.
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
            pcVar5 = (pvVar18->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_330,pcVar5,pcVar5 + pvVar18->_M_string_length);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::pop_back(&((psVar11->
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->operands);
            local_2e8 = (undefined1  [8])0x0;
            vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
            vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
            peVar32 = (psVar11->
                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            pvVar33 = *(pointer *)&peVar32->operands;
            pvVar6 = (peVar32->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pvVar33 != pvVar6) {
              do {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pvVar33);
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_1c0,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c8);
                convert_operand_to_value((Value *)local_358,this_02,&local_1c0);
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                emplace_back<mir::inst::Value>
                          ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2e8,
                           (Value *)local_358);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_1c0.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_240,&local_1c0);
                local_1c0.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [(byte)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                          ((anon_class_1_0_00000001 *)local_358,
                           (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2c8);
                pvVar33 = pvVar33 + 1;
              } while (pvVar33 != pvVar6);
              peVar32 = (local_338->
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            }
            pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
            std::
            make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                      ((VarId *)local_2c8,pbVar19,
                       (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_330);
            local_358 = local_2c8;
            local_2c8 = (undefined1  [8])0x0;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_358);
            psVar11 = local_338;
            if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
              (**(code **)(*(_func_int **)local_358 + 0x28))();
            }
            std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>
                         *)local_2c8);
            if ((__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)
                local_2e8 !=
                (__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)0x0)
            {
              operator_delete((void *)local_2e8,
                              vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                              super__Move_assign_alias<int,_mir::inst::VarId>.
                              super__Copy_assign_alias<int,_mir::inst::VarId>.
                              super__Move_ctor_alias<int,_mir::inst::VarId>.
                              super__Copy_ctor_alias<int,_mir::inst::VarId>.
                              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                              (long)local_2e8);
            }
            if (local_330 !=
                (undefined1  [8])
                ((long)&local_328.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
              operator_delete((void *)local_330,
                              local_328.super__Variant_base<int,_mir::inst::VarId>.
                              super__Move_assign_alias<int,_mir::inst::VarId>.
                              super__Copy_assign_alias<int,_mir::inst::VarId>.
                              super__Move_ctor_alias<int,_mir::inst::VarId>.
                              super__Copy_ctor_alias<int,_mir::inst::VarId>.
                              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1);
            }
          }
          pvVar17 = std::
                    get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              (&((psVar11->
                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->op);
          if (*pvVar17 == Phi) {
            local_358 = (undefined1  [8])0x0;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = (VarId *)0x0;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = (VarId *)0x0;
            peVar32 = (psVar11->
                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            pOVar29 = *(OpInst **)&peVar32->operands;
            local_220 = (OpInst *)
                        (peVar32->operands).
                        super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            local_2f0 = p_Var38;
            if (pOVar29 != local_220) {
              do {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pOVar29);
                pvVar20 = std::
                          get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                    ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_2c8);
                psVar11 = (this_02->nodes).
                          super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                peVar32 = psVar11[pvVar20->id].
                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                this_00 = psVar11[pvVar20->id].
                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                local_2e8 = (undefined1  [8])&PTR_display_001eb100;
                vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                     (_Uninitialized<int,_true>)-1;
                if ((peVar32->mainVar).field_0x18 == '\0') {
                  if ((peVar32->live_vars).
                      super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                      _M_node._M_size != 0) {
                    vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                         (_Uninitialized<int,_true>)
                         *(uint32_t *)
                          (*(long *)&(peVar32->live_vars).
                                     super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                          + 0x18);
                    goto LAB_0012a7c5;
                  }
                  uVar36 = *(uint32_t *)
                            (*(long *)&(peVar32->local_vars).
                                       super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                            + 0x18);
                  vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)uVar36;
                  peVar32 = (local_338->
                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                  DVar15._vptr_Displayable = (_func_int **)operator_new(0x38);
                  local_328.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                       (peVar32->mainVar).field_0x18;
                  local_240 = (undefined1  [8])&local_328;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)local_328.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_a78179b7_conflict *)local_240,
                             (variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
                  _Var21._M_head_impl = local_300._M_head_impl;
                  local_330 = (undefined1  [8])local_300._M_head_impl;
                  local_328.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ =
                       (peVar32->mainVar).shift;
                  local_328.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                       (peVar32->mainVar).shift_amount;
                  (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar36;
                  *DVar15._vptr_Displayable = (_func_int *)local_248;
                  local_240 = (undefined1  [8])(DVar15._vptr_Displayable + 4);
                  *(__index_type *)(DVar15._vptr_Displayable + 6) =
                       local_328.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)local_328.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_a78179b7_conflict *)local_240,&local_328);
                  (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                       (_func_int **)_Var21._M_head_impl;
                  *(undefined2 *)((long)DVar15._vptr_Displayable + 0x31) =
                       local_328.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                  local_330 = (undefined1  [8])DVar15._vptr_Displayable;
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  ::
                  emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                            (local_2f8,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             local_330);
                  this_02 = local_250;
                  p_Var38 = local_2f0;
                  if (local_330 != (undefined1  [8])0x0) {
                    (**(code **)(*(_func_int **)local_330 + 0x28))();
                  }
                }
                else {
                  pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)
                                       &(peVar32->mainVar).field_0x8);
                  vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                       (_Uninitialized<int,_true>)pvVar13->id;
LAB_0012a7c5:
                }
                if (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ ==
                    vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_) {
                  std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
                  _M_realloc_insert<mir::inst::VarId_const&>
                            ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)local_358,
                             (iterator)
                             vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_,
                             (VarId *)local_2e8);
                }
                else {
                  *(undefined ***)
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                       &PTR_display_001eb100;
                  *(_Uninitialized<int,_true> *)
                   (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ + 8) =
                       vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage;
                  vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                       vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ + 0x10;
                }
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [(byte)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                          ((anon_class_1_0_00000001 *)local_330,
                           (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2c8);
                pOVar29 = (OpInst *)&(pOVar29->lhs).field_0x10;
              } while (pOVar29 != local_220);
              peVar32 = (local_338->
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            }
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
            _Var21._M_head_impl = (Inst *)operator_new(0x40);
            uVar36 = pvVar13->id;
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2c8,
                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_358);
            p_Var31 = local_308;
            (((VarId *)((long)_Var21._M_head_impl + 8))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)((long)_Var21._M_head_impl + 0x10) = uVar36;
            *(undefined ***)_Var21._M_head_impl = local_1f0;
            (((Value *)((long)_Var21._M_head_impl + 0x18))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)((long)_Var21._M_head_impl + 0x20) = uVar36;
            std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                       ((long)_Var21._M_head_impl + 0x28),
                       (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2c8);
            if (local_2c8 != (undefined1  [8])0x0) {
              local_330 = (undefined1  [8])_Var21._M_head_impl;
              operator_delete((void *)local_2c8,
                              local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_ -
                              (long)local_2c8);
              _Var21._M_head_impl = (Inst *)local_330;
            }
            local_330 = (undefined1  [8])0x0;
            local_2c8 = (undefined1  [8])_Var21._M_head_impl;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2c8);
            if (local_2c8 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_2c8 + 0x28))();
            }
            if (local_330 != (undefined1  [8])0x0) {
              std::default_delete<mir::inst::PhiInst>::operator()
                        ((default_delete<mir::inst::PhiInst> *)local_330,(PhiInst *)local_330);
            }
            if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
              operator_delete((void *)local_358,
                              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                              super__Move_assign_alias<int,_mir::inst::VarId>.
                              super__Copy_assign_alias<int,_mir::inst::VarId>.
                              super__Move_ctor_alias<int,_mir::inst::VarId>.
                              super__Copy_ctor_alias<int,_mir::inst::VarId>.
                              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                              (long)local_358);
            }
          }
          else {
            pvVar17 = std::
                      get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&((psVar11->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->op);
            if (*pvVar17 == Load) {
              pvVar20 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     **)&((psVar11->
                                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->operands);
              peVar32 = (this_02->nodes).
                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[pvVar20->id].
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                   (peVar32->mainVar).field_0x18;
              local_2c8 = (undefined1  [8])&vStack_350;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_2c8,
                         (variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
              local_358 = (undefined1  [8])local_300._M_head_impl;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = (peVar32->mainVar).shift;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                   (peVar32->mainVar).shift_amount;
              if (this_02->offset_inst == true) {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_f8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(*(long *)&((psVar11->
                                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->operands + 0x28));
                convert_operand_to_value((Value *)local_2e8,this_02,&local_f8);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_f8.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_f8);
                local_f8.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)
                                     &(((local_338->
                                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->mainVar).field_0x8);
                DVar15._vptr_Displayable = (_func_int **)operator_new(0x58);
                local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                local_240 = (undefined1  [8])(local_2c8 + 8);
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)((anon_class_8_1_a78179b7_conflict *)local_240,&vStack_350);
                local_2c8 = (undefined1  [8])local_300._M_head_impl;
                local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                local_240 = (undefined1  [8])&PTR_display_001eb100;
                local_238.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                     (_Uninitialized<int,_true>)pvVar13->id;
                local_328.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                     vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                local_260.super_Displayable._vptr_Displayable = (_func_int **)&local_328;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)((anon_class_8_1_a78179b7_conflict *)&local_260,&vStack_2e0);
                local_330 = (undefined1  [8])local_300._M_head_impl;
                local_328.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                     vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                mir::inst::LoadOffsetInst::LoadOffsetInst
                          ((LoadOffsetInst *)DVar15._vptr_Displayable,(Value *)local_2c8,
                           (VarId *)local_240,(Value *)local_330);
                local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_2f8,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           local_2c8);
                goto LAB_0012a484;
              }
              local_2f0 = p_Var38;
              pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((psVar11->
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->mainVar).field_0x8);
              DVar15._vptr_Displayable = (_func_int **)operator_new(0x38);
              local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
              local_330 = (undefined1  [8])(local_2c8 + 8);
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                             super__Move_assign_alias<int,_mir::inst::VarId>.
                             super__Copy_assign_alias<int,_mir::inst::VarId>.
                             super__Move_ctor_alias<int,_mir::inst::VarId>.
                             super__Copy_ctor_alias<int,_mir::inst::VarId>.
                             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_330,&vStack_350);
              _Var21._M_head_impl = local_300._M_head_impl;
              local_2c8 = (undefined1  [8])local_300._M_head_impl;
              local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                   vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
              uVar36 = pvVar13->id;
              (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                   (_func_int **)&PTR_display_001eb100;
              *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar36;
              *DVar15._vptr_Displayable = (_func_int *)local_208;
              local_330 = (undefined1  [8])(DVar15._vptr_Displayable + 4);
              *(undefined1 *)(DVar15._vptr_Displayable + 6) =
                   local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr
                [(long)(char)local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
                _M_data)((anon_class_8_1_a78179b7_conflict *)local_330,
                         (variant<int,_mir::inst::VarId> *)(local_2c8 + 8));
              (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                   (_func_int **)_Var21._M_head_impl;
              *(undefined2 *)((long)DVar15._vptr_Displayable + 0x31) =
                   local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
              local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        (local_2f8,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_2c8);
LAB_0012b5ee:
              p_Var31 = local_308;
              p_Var38 = local_2f0;
              if (local_2c8 == (undefined1  [8])0x0) goto switchD_0012a4dd_default;
LAB_0012a494:
              (**(code **)(*(_func_int **)local_2c8 + 0x28))();
              p_Var31 = local_308;
            }
            else {
              pvVar17 = std::
                        get<2ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                  (&((psVar11->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->op);
              p_Var31 = local_308;
              if (*pvVar17 == Store) {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_120,
                                  *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    **)&((psVar11->
                                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->operands);
                convert_operand_to_value((Value *)local_358,this_02,&local_120);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_120.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_120);
                local_120.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_148,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(*(long *)&((local_338->
                                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->operands + 0x28));
                convert_operand_to_value((Value *)local_2e8,this_02,&local_148);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_148.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_148);
                local_148.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                if (this_02->offset_inst != true) {
                  local_2f0 = p_Var38;
                  pvVar13 = std::get<1ul,int,mir::inst::VarId>(&vStack_2e0);
                  DVar15._vptr_Displayable = (_func_int **)operator_new(0x38);
                  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                       vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                  local_330 = (undefined1  [8])(local_2c8 + 8);
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                    _M_data)((anon_class_8_1_a78179b7_conflict *)local_330,&vStack_350);
                  _Var21._M_head_impl = local_300._M_head_impl;
                  local_2c8 = (undefined1  [8])local_300._M_head_impl;
                  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                       vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                  uVar36 = pvVar13->id;
                  (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar36;
                  *DVar15._vptr_Displayable = (_func_int *)local_210;
                  local_330 = (undefined1  [8])(DVar15._vptr_Displayable + 4);
                  *(undefined1 *)(DVar15._vptr_Displayable + 6) =
                       local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
                  (*std::__detail::__variant::
                    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                    ::_S_vtable._M_arr
                    [(long)(char)local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ +
                     1]._M_data)((anon_class_8_1_a78179b7_conflict *)local_330,
                                 (variant<int,_mir::inst::VarId> *)(local_2c8 + 8));
                  (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                       (_func_int **)_Var21._M_head_impl;
                  *(undefined2 *)((long)DVar15._vptr_Displayable + 0x31) =
                       local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
                  local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
                  std::
                  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  ::
                  emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                            (local_2f8,
                             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             local_2c8);
                  goto LAB_0012b5ee;
                }
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_170,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)(*(long *)&((local_338->
                                                 super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr)->operands + 0x50));
                convert_operand_to_value((Value *)local_240,this_02,&local_170);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_170.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_170);
                local_170.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                pvVar13 = std::get<1ul,int,mir::inst::VarId>(&vStack_2e0);
                DVar15._vptr_Displayable = (_func_int **)operator_new(0x58);
                local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                local_260.super_Displayable._vptr_Displayable = (_func_int **)(local_2c8 + 8);
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)((anon_class_8_1_a78179b7_conflict *)&local_260,&vStack_350);
                local_2c8 = (undefined1  [8])local_300._M_head_impl;
                local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                     vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                local_260.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_260.id = pvVar13->id;
                local_328.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                     local_238.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
                local_1e8.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_328;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                  ::_S_vtable._M_arr
                  [(long)(char)local_238.super__Variant_base<int,_mir::inst::VarId>.
                               super__Move_assign_alias<int,_mir::inst::VarId>.
                               super__Copy_assign_alias<int,_mir::inst::VarId>.
                               super__Move_ctor_alias<int,_mir::inst::VarId>.
                               super__Copy_ctor_alias<int,_mir::inst::VarId>.
                               super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1].
                  _M_data)(&local_1e8,&local_238);
                local_330 = (undefined1  [8])local_300._M_head_impl;
                local_328.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                     local_238.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
                mir::inst::StoreOffsetInst::StoreOffsetInst
                          ((StoreOffsetInst *)DVar15._vptr_Displayable,(Value *)local_2c8,&local_260
                           ,(Value *)local_330);
                local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          (local_2f8,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           local_2c8);
LAB_0012a484:
                p_Var31 = local_308;
                if (local_2c8 != (undefined1  [8])0x0) goto LAB_0012a494;
              }
            }
          }
        }
        else if (_Var1 == '\x01') {
          pvVar16 = std::
                    get<1ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                              (&peVar32->op);
          psVar11 = local_338;
          p_Var31 = local_308;
          switch(*pvVar16) {
          case Ref:
            local_330 = (undefined1  [8])&PTR_display_001eb100;
            local_328.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                 (_Uninitialized<int,_true>)-1;
            local_310 = '\0';
            __v = *(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    **)&((local_338->
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->operands;
            if ((__v->
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index == '\x01') {
              local_2f0 = p_Var38;
              pvVar20 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  (__v);
              pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)
                                   &(((this_02->nodes).
                                      super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[pvVar20->id].
                                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->mainVar).field_0x8);
              std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                        ((variant<mir::inst::VarId,std::__cxx11::string> *)local_330,pvVar13);
            }
            else {
              local_2f0 = p_Var38;
              pvVar18 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  (__v);
              std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                        ((variant<mir::inst::VarId,std::__cxx11::string> *)local_330,pvVar18);
            }
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((psVar11->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            _Var23._M_t.
            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
            super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                 (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)operator_new(0x40)
            ;
            uVar36 = pvVar13->id;
            std::__detail::__variant::
            _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_2c8,
                              (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_330);
            *(undefined ***)
             ((long)_Var23._M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
                 &PTR_display_001eb100;
            *(uint32_t *)
             ((long)_Var23._M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10) = uVar36;
            *(undefined ***)
             _Var23._M_t.
             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_1f8;
            std::__detail::__variant::
            _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)_Var23._M_t.
                                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl + 0x18),
                              (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_2c8);
            p_Var38 = local_2f0;
            local_2e8 = (undefined1  [8])
                        _Var23._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
            std::__detail::__variant::
            _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_2c8);
            local_358 = local_2e8;
            local_2e8 = (undefined1  [8])0x0;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_358);
            if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
              (**(code **)(*(_func_int **)local_358 + 0x28))();
            }
            local_358 = (undefined1  [8])0x0;
            std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                        local_2e8);
            std::__detail::__variant::
            _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_330);
            p_Var31 = local_308;
            break;
          case Ptroffset:
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_a8,
                              *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                **)&((local_338->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->operands);
            convert_operand_to_value((Value *)local_2c8,this_02,&local_a8);
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)(local_2c8 + 8));
            uVar36 = pvVar13->id;
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_a8.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_330,&local_a8);
            local_a8.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_d0,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(*(long *)&((local_338->
                                             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr)->operands + 0x28));
            convert_operand_to_value((Value *)local_330,this_02,&local_d0);
            local_2f0 = p_Var38;
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_d0.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_d0);
            local_d0.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((local_338->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            DVar15._vptr_Displayable = (_func_int **)operator_new(0x48);
            uVar2 = pvVar13->id;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                 local_328.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_358 = (undefined1  [8])((long)local_2c8 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_328.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)local_358,&local_328);
            _Var21._M_head_impl = local_300._M_head_impl;
            local_2c8 = (undefined1  [8])local_300._M_head_impl;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                 local_328.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar2;
            *DVar15._vptr_Displayable = (_func_int *)local_200;
            (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)(DVar15._vptr_Displayable + 4) = uVar36;
            local_358 = (undefined1  [8])(DVar15._vptr_Displayable + 6);
            *(undefined1 *)(DVar15._vptr_Displayable + 8) =
                 local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
              _M_data)((anon_class_8_1_a78179b7_conflict *)local_358,
                       (variant<int,_mir::inst::VarId> *)(local_2c8 + 8));
            DVar15._vptr_Displayable[5] = (_func_int *)_Var21._M_head_impl;
            *(undefined2 *)((long)DVar15._vptr_Displayable + 0x41) =
                 local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
            local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2c8);
            goto LAB_0012b5ee;
          case Assign:
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ & 0xffffffff00000000
            ;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
            local_358 = (undefined1  [8])local_300._M_head_impl;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_2c8,
                              *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                **)&((local_338->
                                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->operands);
            if ((byte)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left == 1) {
              local_2f0 = p_Var38;
              pvVar20 = std::get<1ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  (*(variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     **)&((psVar11->
                                          super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr)->operands);
              peVar32 = (this_02->nodes).
                        super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[pvVar20->id].
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_330 = (undefined1  [8])&vStack_350;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                ::_S_vtable._M_arr[(long)(char)(peVar32->mainVar).field_0x18 + 1]._M_data)
                        ((anon_class_8_1_8991fb9c_conflict *)local_330,
                         (variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._17_1_ = (peVar32->mainVar).shift;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._18_1_ =
                   (peVar32->mainVar).shift_amount;
            }
            else {
              local_2f0 = p_Var38;
              pvVar22 = std::get<0ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                  ((variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_2c8);
              if (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                  super__Move_assign_alias<int,_mir::inst::VarId>.
                  super__Copy_assign_alias<int,_mir::inst::VarId>.
                  super__Move_ctor_alias<int,_mir::inst::VarId>.
                  super__Copy_ctor_alias<int,_mir::inst::VarId>.
                  super__Variant_storage_alias<int,_mir::inst::VarId>._M_index != '\0') {
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_index = '\0';
              }
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                   (_Uninitialized<int,_true>)*pvVar22;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ = 1;
            }
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((psVar11->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            DVar15._vptr_Displayable = (_func_int **)operator_new(0x38);
            uVar36 = pvVar13->id;
            local_328.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_2e8 = (undefined1  [8])&local_328;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)local_2e8,&vStack_350);
            _Var21._M_head_impl = local_300._M_head_impl;
            local_330 = (undefined1  [8])local_300._M_head_impl;
            local_328.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar36;
            *DVar15._vptr_Displayable = (_func_int *)local_248;
            local_2e8 = (undefined1  [8])(DVar15._vptr_Displayable + 4);
            *(__index_type *)(DVar15._vptr_Displayable + 6) =
                 local_328.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_328.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)local_2e8,&local_328);
            (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                 (_func_int **)_Var21._M_head_impl;
            *(undefined2 *)((long)DVar15._vptr_Displayable + 0x31) =
                 local_328.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            local_330 = (undefined1  [8])DVar15._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_330);
            p_Var38 = local_2f0;
            if (local_330 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_330 + 0x28))();
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr[(byte)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left].
              _M_data)((anon_class_1_0_00000001 *)local_330,
                       (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_2c8);
            p_Var31 = local_308;
            break;
          case Call:
            pvVar18 = std::get<2ul,int,optimization::common_expr_del::NodeId,std::__cxx11::string>
                                ((((local_338->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->operands).
                                 super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 0xffffffffffffffff);
            local_330 = (undefined1  [8])
                        ((long)&local_328.super__Variant_base<int,_mir::inst::VarId>.
                                super__Move_assign_alias<int,_mir::inst::VarId>.
                                super__Copy_assign_alias<int,_mir::inst::VarId>.
                                super__Move_ctor_alias<int,_mir::inst::VarId>.
                                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
            pcVar5 = (pvVar18->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_330,pcVar5,pcVar5 + pvVar18->_M_string_length);
            std::
            vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::pop_back(&((psVar11->
                         super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->operands);
            local_2e8 = (undefined1  [8])0x0;
            vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
            vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
            peVar32 = (psVar11->
                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            pvVar33 = *(pointer *)&peVar32->operands;
            pvVar6 = (peVar32->operands).
                     super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pvVar33 != pvVar6) {
              do {
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c8,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)pvVar33);
                std::__detail::__variant::
                _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_198,
                                  (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c8);
                convert_operand_to_value((Value *)local_358,this_02,&local_198);
                std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
                emplace_back<mir::inst::Value>
                          ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_2e8,
                           (Value *)local_358);
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [local_198.
                   super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   .
                   super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                   ._M_index]._M_data)((anon_class_1_0_00000001 *)local_240,&local_198);
                local_198.
                super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                .
                super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
                ._M_index = 0xff;
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                  ::_S_vtable._M_arr
                  [(byte)local_2c0._M_impl.super__Rb_tree_header._M_header._M_left]._M_data)
                          ((anon_class_1_0_00000001 *)local_358,
                           (variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2c8);
                pvVar33 = pvVar33 + 1;
              } while (pvVar33 != pvVar6);
              peVar32 = (local_338->
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
            }
            pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
            std::
            make_unique<mir::inst::CallInst,mir::inst::VarId&,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                      ((VarId *)local_2c8,pbVar19,
                       (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_330);
            local_358 = local_2c8;
            local_2c8 = (undefined1  [8])0x0;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_358);
            if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_358
                != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
              (**(code **)(*(_func_int **)local_358 + 0x28))();
            }
            std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::
            ~unique_ptr((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>
                         *)local_2c8);
            if ((__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)
                local_2e8 !=
                (__uniq_ptr_impl<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>)0x0)
            {
              operator_delete((void *)local_2e8,
                              vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                              super__Move_assign_alias<int,_mir::inst::VarId>.
                              super__Copy_assign_alias<int,_mir::inst::VarId>.
                              super__Move_ctor_alias<int,_mir::inst::VarId>.
                              super__Copy_ctor_alias<int,_mir::inst::VarId>.
                              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ -
                              (long)local_2e8);
            }
            p_Var31 = local_308;
            if (local_330 !=
                (undefined1  [8])
                ((long)&local_328.super__Variant_base<int,_mir::inst::VarId>.
                        super__Move_assign_alias<int,_mir::inst::VarId>.
                        super__Copy_assign_alias<int,_mir::inst::VarId>.
                        super__Move_ctor_alias<int,_mir::inst::VarId>.
                        super__Copy_ctor_alias<int,_mir::inst::VarId>.
                        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
              operator_delete((void *)local_330,
                              local_328.super__Variant_base<int,_mir::inst::VarId>.
                              super__Move_assign_alias<int,_mir::inst::VarId>.
                              super__Copy_assign_alias<int,_mir::inst::VarId>.
                              super__Move_ctor_alias<int,_mir::inst::VarId>.
                              super__Copy_ctor_alias<int,_mir::inst::VarId>.
                              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1);
              p_Var31 = local_308;
            }
          }
        }
        else {
          p_Var31 = local_308;
          if (_Var1 == '\0') {
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_58,
                              *(_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                **)&peVar32->operands);
            convert_operand_to_value((Value *)local_358,this_02,&local_58);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_58.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_58);
            local_58.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            std::__detail::__variant::
            _Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_80,
                              (_Copy_ctor_base<false,_int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)(*(long *)&((local_338->
                                             super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr)->operands + 0x28));
            convert_operand_to_value((Value *)local_2e8,this_02,&local_80);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
              ::_S_vtable._M_arr
              [local_80.
               super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               .
               super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
               ._M_index]._M_data)((anon_class_1_0_00000001 *)local_2c8,&local_80);
            psVar11 = local_338;
            local_80.
            super__Variant_base<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super__Move_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_assign_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Move_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Copy_ctor_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            .
            super__Variant_storage_alias<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char>_>
            ._M_index = 0xff;
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)
                                 &(((local_338->
                                    super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->mainVar).field_0x8);
            pvVar14 = std::
                      get<0ul,mir::inst::Op,optimization::common_expr_del::ExtraNormOp,optimization::common_expr_del::InNormOp>
                                (&((psVar11->
                                   super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->op);
            DVar15._vptr_Displayable = (_func_int **)operator_new(0x60);
            local_240 = (undefined1  [8])&PTR_display_001eb100;
            local_238.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                 (_Uninitialized<int,_true>)pvVar13->id;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_260.super_Displayable._vptr_Displayable = (_func_int **)(local_2c8 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)&local_260,&vStack_350);
            local_2c8 = (undefined1  [8])local_300._M_head_impl;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_ =
                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            local_328.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                 vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
            local_260.super_Displayable._vptr_Displayable = (_func_int **)&local_328;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                           super__Move_assign_alias<int,_mir::inst::VarId>.
                           super__Copy_assign_alias<int,_mir::inst::VarId>.
                           super__Move_ctor_alias<int,_mir::inst::VarId>.
                           super__Copy_ctor_alias<int,_mir::inst::VarId>.
                           super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data
            )((anon_class_8_1_a78179b7_conflict *)&local_260,&vStack_2e0);
            local_330 = (undefined1  [8])local_300._M_head_impl;
            local_328.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                 vStack_2e0.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
            mir::inst::OpInst::OpInst
                      ((OpInst *)DVar15._vptr_Displayable,(VarId *)local_240,(Value *)local_2c8,
                       (Value *)local_330,*pvVar14);
            local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2c8);
            goto LAB_0012a484;
          }
        }
      }
switchD_0012a4dd_default:
      p_Var38 = p_Var38->_M_next;
    } while (p_Var38 != p_Var31);
    p_Var38 = p_Var31->_M_next;
  }
  if (p_Var38 != p_Var31) {
    local_248 = &PTR_display_001ecfe8;
    do {
      local_338 = (this_02->nodes).
                  super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      lVar41 = (long)local_338[*(uint *)&p_Var38[1]._M_next].
                     super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
      local_2f0 = p_Var38;
      if (*(long *)(lVar41 + 0x58) != 0) {
        local_300._M_head_impl = (Inst *)(lVar41 + 0x48);
        pOVar29 = (OpInst *)
                  (((OpInst *)local_300._M_head_impl)->super_Inst).super_Displayable.
                  _vptr_Displayable;
        if (pOVar29 != (OpInst *)local_300._M_head_impl) {
          local_338 = local_338 + *(uint *)&p_Var38[1]._M_next;
          do {
            uVar36 = *(uint32_t *)&(pOVar29->lhs).super_Displayable._vptr_Displayable;
            peVar32 = (local_338->
                      super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr;
            local_220 = pOVar29;
            DVar15._vptr_Displayable = (_func_int **)operator_new(0x38);
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
                 (peVar32->mainVar).field_0x18;
            local_330 = (undefined1  [8])(local_2c8 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
              _M_data)((anon_class_8_1_a78179b7_conflict *)local_330,
                       (variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
            local_2c8 = (undefined1  [8])&PTR_display_001ecf98;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_1_ =
                 (peVar32->mainVar).shift;
            local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._2_1_ =
                 (peVar32->mainVar).shift_amount;
            (((VarId *)(DVar15._vptr_Displayable + 1))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001eb100;
            *(uint32_t *)(DVar15._vptr_Displayable + 2) = uVar36;
            *DVar15._vptr_Displayable = (_func_int *)local_248;
            local_330 = (undefined1  [8])(DVar15._vptr_Displayable + 4);
            *(undefined1 *)(DVar15._vptr_Displayable + 6) =
                 local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ + 1].
              _M_data)((anon_class_8_1_a78179b7_conflict *)local_330,
                       (variant<int,_mir::inst::VarId> *)(local_2c8 + 8));
            (((Value *)(DVar15._vptr_Displayable + 3))->super_Displayable)._vptr_Displayable =
                 (_func_int **)&PTR_display_001ecf98;
            *(undefined2 *)((long)DVar15._vptr_Displayable + 0x31) =
                 local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent._1_2_;
            local_2c8 = (undefined1  [8])DVar15._vptr_Displayable;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       local_2c8);
            if (local_2c8 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_2c8 + 0x28))();
            }
            pOVar29 = (OpInst *)(local_220->super_Inst).super_Displayable._vptr_Displayable;
          } while (pOVar29 != (OpInst *)local_300._M_head_impl);
        }
      }
      p_Var38 = local_2f0->_M_next;
      p_Var31 = local_308;
      this_02 = local_250;
    } while (p_Var38 != local_308);
  }
  pBVar9 = local_218;
  if (((local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
       .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) &&
     (local_328.super__Variant_base<int,_mir::inst::VarId>.
      super__Move_assign_alias<int,_mir::inst::VarId>.
      super__Copy_assign_alias<int,_mir::inst::VarId>.super__Move_ctor_alias<int,_mir::inst::VarId>.
      super__Copy_ctor_alias<int,_mir::inst::VarId>.
      super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
           (_Uninitialized<int,_true>)
           (local_218->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
           _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id,
     local_328.super__Variant_base<int,_mir::inst::VarId>.
     super__Move_assign_alias<int,_mir::inst::VarId>.super__Copy_assign_alias<int,_mir::inst::VarId>
     .super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
     super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage != 0)) {
    local_330 = (undefined1  [8])&PTR_display_001eb100;
    pmVar24 = std::
              map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
              ::operator[](&this_02->var_map,(key_type *)local_330);
    pvVar13 = std::get<1ul,int,mir::inst::VarId>
                        ((variant<int,_mir::inst::VarId> *)
                         &(((this_02->nodes).
                            super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[pmVar24->id].
                            super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mainVar).field_0x8);
    uVar36 = pvVar13->id;
    if ((pBVar9->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
      (pBVar9->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      (pBVar9->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
    (pBVar9->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar36;
    puVar39 = (pBVar9->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar25 = (pBVar9->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar39 != puVar25) {
      lVar41 = (long)puVar39 * -0x20000000;
      do {
        pIVar4 = (puVar39->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        if ((pIVar4->dest).id == uVar36) {
          iVar10 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
          this_01 = local_2f8;
          if (iVar10 == 1) {
            lVar7 = *(long *)local_2f8;
            std::
            vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
            ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                      (local_2f8,puVar39);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        *)this_01,
                       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                       ((-(lVar7 * 0x20000000 + lVar41) >> 0x1d) + *(long *)this_01));
            break;
          }
          puVar25 = (local_218->inst).
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        puVar39 = puVar39 + 1;
        lVar41 = lVar41 + -0x100000000;
      } while (puVar39 != puVar25);
    }
    var_replace::Var_Replace::Var_Replace((Var_Replace *)local_2c8,(MirFunction *)*env);
    p_Var38 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var31->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var38 != p_Var31) {
      do {
        uVar3 = *(uint *)&p_Var38[1]._M_next;
        psVar11 = (local_250->nodes).
                  super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        peVar32 = psVar11[uVar3].
                  super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        if ((peVar32->live_vars).
            super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl._M_node.
            _M_size != 0) {
          if ((peVar32->mainVar).field_0x18 == '\0') {
            for (puVar34 = *(undefined8 **)
                            &(peVar32->live_vars).
                             super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>;
                (list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)puVar34 !=
                &peVar32->live_vars; puVar34 = (undefined8 *)*puVar34) {
              local_358 = (undefined1  [8])&PTR_display_001eb100;
              vStack_350.super__Variant_base<int,_mir::inst::VarId>.
              super__Move_assign_alias<int,_mir::inst::VarId>.
              super__Copy_assign_alias<int,_mir::inst::VarId>.
              super__Move_ctor_alias<int,_mir::inst::VarId>.
              super__Copy_ctor_alias<int,_mir::inst::VarId>.
              super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                   (_Uninitialized<int,_true>)*(undefined4 *)(puVar34 + 3);
              pmVar26 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)(*env + 0x38),(key_type_conflict *)&vStack_350);
              if (pmVar26->is_phi_var == false) {
                uVar35 = vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                         super__Move_assign_alias<int,_mir::inst::VarId>.
                         super__Copy_assign_alias<int,_mir::inst::VarId>.
                         super__Move_ctor_alias<int,_mir::inst::VarId>.
                         super__Copy_ctor_alias<int,_mir::inst::VarId>.
                         super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                         _M_storage;
                goto LAB_0012b978;
              }
            }
          }
          else {
            pvVar13 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&(peVar32->mainVar).field_0x8);
            local_358 = (undefined1  [8])&PTR_display_001eb100;
            vStack_350.super__Variant_base<int,_mir::inst::VarId>.
            super__Move_assign_alias<int,_mir::inst::VarId>.
            super__Copy_assign_alias<int,_mir::inst::VarId>.
            super__Move_ctor_alias<int,_mir::inst::VarId>.
            super__Copy_ctor_alias<int,_mir::inst::VarId>.
            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                 (_Uninitialized<int,_true>)pvVar13->id;
            pmVar26 = std::
                      map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                      ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)(*env + 0x38),(key_type_conflict *)&vStack_350);
            if (pmVar26->is_phi_var == false) {
              uVar35 = vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage;
              pmVar26 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                              *)(*env + 0x38),(key_type_conflict *)&vStack_350);
              pmVar26->is_temp_var = false;
LAB_0012b978:
              peVar32 = psVar11[uVar3].
                        super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              for (puVar34 = *(undefined8 **)
                              &(peVar32->live_vars).
                               super__List_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                  ; (list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)puVar34 !=
                    &peVar32->live_vars; puVar34 = (undefined8 *)*puVar34) {
                local_358 = (undefined1  [8])&PTR_display_001eb100;
                vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                super__Move_assign_alias<int,_mir::inst::VarId>.
                super__Copy_assign_alias<int,_mir::inst::VarId>.
                super__Move_ctor_alias<int,_mir::inst::VarId>.
                super__Copy_ctor_alias<int,_mir::inst::VarId>.
                super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
                     (_Uninitialized<int,_true>)*(undefined4 *)(puVar34 + 3);
                pmVar26 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)(*env + 0x38),(key_type_conflict *)&vStack_350);
                if ((pmVar26->is_phi_var == false) &&
                   (vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage !=
                    (_Uninitialized<int,_true>)uVar35)) {
                  local_1d0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  local_1d0.id = (uint32_t)
                                 vStack_350.super__Variant_base<int,_mir::inst::VarId>.
                                 super__Move_assign_alias<int,_mir::inst::VarId>.
                                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first.
                                 _M_storage;
                  local_1e0.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  local_1e0.id = uVar35;
                  var_replace::Var_Replace::replace((Var_Replace *)local_2c8,&local_1d0,&local_1e0);
                }
              }
            }
          }
        }
        p_Var38 = p_Var38->_M_next;
      } while (p_Var38 != local_308);
    }
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_290);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 *)(local_2c8 + 8));
  }
  return;
}

Assistant:

void export_insts(mir::inst::BasicBlk& block) {
    auto& inst = block.inst;
    for (auto iter = nodes.begin(); iter != nodes.end(); ++iter) {
      iter->get()->init_main_var();
    }
    while (added.size() < nodes.size()) {
      for (int i = nodes.size() - 1; i >= 0; --i) {
        exportNode(i);
      }
    }
    inst.clear();
    // for (auto& varpair : var_map) {
    //   if (varpair.first > 10000) {
    //     break;
    //   }
    //   if (varpair.first >= 1) {
    //     inst.push_back(std::make_unique<mir::inst::AssignInst>(
    //         std::get<mir::inst::VarId>(nodes[varpair.second.id]->mainVar),
    //         varpair.first));
    //   }
    // }
    std::reverse(exportQueue.begin(), exportQueue.end());
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (!node->is_leaf) {
        auto opKind = node->op.index();
        switch (opKind) {
          case 0: {
            auto lhs = convert_operand_to_value(node->operands[0]);
            auto rhs = convert_operand_to_value(node->operands[1]);
            auto opInst = std::make_unique<mir::inst::OpInst>(
                std::get<mir::inst::VarId>(node->mainVar), lhs, rhs,
                std::get<NormOp>(node->op));
            inst.push_back(std::move(opInst));
            break;
          }

          case 1: {
            switch (std::get<ExtraNormOp>(node->op)) {
              case ExtraNormOp::Ref: {
                std::variant<mir::inst::VarId, std::string> val;
                if (node->operands[0].index() == 1) {
                  val = std::get<mir::inst::VarId>(
                      nodes[std::get<NodeId>(node->operands[0]).id]->mainVar);
                  //这里可能的VarId是局部数组，理论上不会出现int成为mainVar的情况

                } else {
                  val = std::get<std::string>(node->operands[0]);
                }
                inst.push_back(std::make_unique<mir::inst::RefInst>(
                    std::get<mir::inst::VarId>(node->mainVar), val));
                break;
              }
              case ExtraNormOp::Ptroffset: {
                auto ptr = std::get<mir::inst::VarId>(
                    convert_operand_to_value(node->operands[0]));
                auto offset = convert_operand_to_value(node->operands[1]);
                auto ptrInst = std::make_unique<mir::inst::PtrOffsetInst>(
                    std::get<mir::inst::VarId>(node->mainVar), ptr, offset);
                inst.push_back(std::move(ptrInst));
                break;
              }
              case ExtraNormOp::Assign: {
                mir::inst::Value src(0);
                auto operand = node->operands[0];
                if (operand.index() == 1) {
                  auto srcId = std::get<NodeId>(node->operands[0]);
                  src = nodes[srcId.id]->mainVar;
                } else {
                  src = std::get<int>(operand);
                }

                auto assignInst = std::make_unique<mir::inst::AssignInst>(
                    std::get<mir::inst::VarId>(node->mainVar), src);
                inst.push_back(std::move(assignInst));
                break;
              }
              case ExtraNormOp::Call: {
                auto func = std::get<std::string>(
                    node->operands[node->operands.size() - 1]);
                node->operands.pop_back();
                std::vector<mir::inst::Value> params;
                for (auto operand : node->operands) {
                  params.push_back(convert_operand_to_value(operand));
                }
                auto callInst = std::make_unique<mir::inst::CallInst>(
                    std::get<mir::inst::VarId>(node->mainVar), func, params);
                inst.push_back(std::move(callInst));
              }
            }

            break;
          }

          case 2: {
            if (std::get<InNormOp>(node->op) == InNormOp::Call) {
              auto func = std::get<std::string>(
                  node->operands[node->operands.size() - 1]);
              node->operands.pop_back();
              std::vector<mir::inst::Value> params;
              for (auto operand : node->operands) {
                params.push_back(convert_operand_to_value(operand));
              }
              auto callInst = std::make_unique<mir::inst::CallInst>(
                  std::get<mir::inst::VarId>(node->mainVar), func, params);
              inst.push_back(std::move(callInst));
            }
            if (std::get<InNormOp>(node->op) == InNormOp::Phi) {
              std::vector<mir::inst::VarId> vars;
              for (auto operand : node->operands) {
                auto oper_node = nodes[std::get<NodeId>(operand).id];
                mir::inst::VarId var;
                if (oper_node->mainVar.index() == 0) {
                  // imm

                  if (oper_node->live_vars.size()) {
                    var = oper_node->live_vars.front();
                  } else {
                    var = oper_node->local_vars.front();
                    auto assignInst = std::make_unique<mir::inst::AssignInst>(
                        var, node->mainVar);
                    inst.push_back(std::move(assignInst));
                  }
                } else {
                  var = std::get<mir::inst::VarId>(oper_node->mainVar);
                }
                vars.push_back(var);
              }
              auto phiInst = std::make_unique<mir::inst::PhiInst>(
                  std::get<mir::inst::VarId>(node->mainVar), vars);
              inst.push_back(std::move(phiInst));
            } else if (std::get<InNormOp>(node->op) == InNormOp::Load) {
              auto src = nodes[std::get<NodeId>(node->operands[0]).id]->mainVar;
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[1]);
                auto loadInst = std::make_unique<mir::inst::LoadOffsetInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto loadInst = std::make_unique<mir::inst::LoadInst>(
                    src, std::get<mir::inst::VarId>(node->mainVar));
                inst.push_back(std::move(loadInst));
              }

            } else if (std::get<InNormOp>(node->op) == InNormOp::Store) {
              auto val = convert_operand_to_value(node->operands[0]);
              auto dest = convert_operand_to_value(node->operands[1]);
              if (offset_inst) {
                auto offset = convert_operand_to_value(node->operands[2]);
                auto loadInst = std::make_unique<mir::inst::StoreOffsetInst>(
                    val, std::get<mir::inst::VarId>(dest), offset);
                inst.push_back(std::move(loadInst));
              } else {
                auto storeInst = std::make_unique<mir::inst::StoreInst>(
                    val, std::get<mir::inst::VarId>(dest));
                inst.push_back(std::move(storeInst));
              }
            }
            break;
          }
          default:;
        }
      }
      // if (node->live_vars.size()) {
      //   for (auto var : node->live_vars) {
      //     //
      //     if(node->op.index()==1&&std::get<ExtraNormOp>(node->op)==ExtraNormOp::Assign&&node->operands)
      //     auto assignInst =
      //         std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
      //     inst.push_back(std::move(assignInst));
      //   }
      // }
    }
    // this must be in the end, or the livevar might overides the leaf var used
    // after this because they share the same reg
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        for (auto var : node->live_vars) {
          auto assignInst =
              std::make_unique<mir::inst::AssignInst>(var, node->mainVar);
          inst.push_back(std::move(assignInst));
        }
      }
    }

    auto& jump = block.jump;
    if (!jump.cond_or_ret.has_value() || jump.cond_or_ret.value().id == 0) {
      return;
    }
    auto varId = jump.cond_or_ret.value();
    auto& node = nodes[var_map[varId].id];
    mir::inst::VarId var = std::get<mir::inst::VarId>(node->mainVar);
    jump.cond_or_ret = var;
    for (auto iter = block.inst.begin(); iter != block.inst.end();) {
      auto& inst = *iter;
      if (inst->dest == var && inst->inst_kind() == mir::inst::InstKind::Op) {
        int idx = iter - block.inst.begin();
        block.inst.push_back(std::move(inst));
        iter = block.inst.begin() + idx;
        iter = block.inst.erase(iter);

        break;
      } else {
        iter++;
      }
    }

    // replace
    var_replace::Var_Replace vp(env->func);
    for (auto idx : exportQueue) {
      auto& node = nodes[idx];
      if (node->live_vars.size()) {
        std::optional<mir::inst::VarId> not_phi_var;
        if (!node->mainVar.is_immediate()) {
          auto var = std::get<mir::inst::VarId>(node->mainVar);
          if (!env->func.variables.at(var.id).is_phi_var) {
            not_phi_var = var;
            env->func.variables.at(var.id).is_temp_var = false;
          }
        } else {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var) {
              not_phi_var = var;
              break;
            }
          }
        }

        if (not_phi_var.has_value()) {
          for (auto var : node->live_vars) {
            if (!env->func.variables.at(var.id).is_phi_var &&
                var != not_phi_var.value()) {
              vp.replace(var, not_phi_var.value());
            }
          }
        }
      }
    }
  }